

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnyDistributionEdgeCalculator.cpp
# Opt level: O2

void __thiscall
AnyDistributionEdgeCalculator::AnyDistributionEdgeCalculator
          (AnyDistributionEdgeCalculator *this,double significance_level,
          HistogramBasedDistribution *ild)

{
  undefined1 auVar1 [8];
  _Head_base<0UL,_std::vector<double,_std::allocator<double>_>_*,_false> _Var2;
  int iVar3;
  reference pvVar4;
  pointer pdVar5;
  pointer pdVar6;
  vector<double,_std::allocator<double>_> *this_00;
  size_t i;
  ulong uVar7;
  unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
  insert_size_sum_dist;
  double local_28;
  undefined1 local_20 [8];
  _Head_base<0UL,_std::vector<double,_std::allocator<double>_>_*,_false> local_18;
  
  (this->super_EdgeCalculator)._vptr_EdgeCalculator =
       (_func_int **)&PTR__AnyDistributionEdgeCalculator_001d70f8;
  this->significance_level = significance_level;
  HistogramBasedDistribution::toDistribution
            ((HistogramBasedDistribution *)local_20,0.0001,(int *)ild);
  auVar1 = local_20;
  local_20 = (undefined1  [8])0x0;
  this->insert_size_dist = (vector<double,_std::allocator<double>_> *)auVar1;
  std::
  unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
                 *)local_20);
  local_28 = 0.0;
  uVar7 = 0;
  while( true ) {
    this_00 = this->insert_size_dist;
    pdVar6 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((ulong)((long)pdVar5 - (long)pdVar6 >> 3) <= uVar7) break;
    pvVar4 = std::vector<double,_std::allocator<double>_>::at(this_00,uVar7);
    local_28 = local_28 + *pvVar4;
    uVar7 = uVar7 + 1;
  }
  for (uVar7 = 0; uVar7 < (ulong)((long)pdVar5 - (long)pdVar6 >> 3); uVar7 = uVar7 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::at(this_00,uVar7);
    *pvVar4 = *pvVar4 / local_28;
    this_00 = this->insert_size_dist;
    pdVar6 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  iVar3 = computeAllowableInsertSizeDiff(this);
  this->allowable_insert_size_diff = iVar3;
  Distributions::convolve
            ((Distributions *)local_20,this->insert_size_dist,this->insert_size_dist,
             this->insert_size_dist_offset,this->insert_size_dist_offset,
             &this->insert_size_sum_ccdf_offset);
  Distributions::toCCDF
            ((Distributions *)&local_18,(vector<double,_std::allocator<double>_> *)local_20);
  _Var2._M_head_impl = local_18._M_head_impl;
  local_18._M_head_impl = (vector<double,_std::allocator<double>_> *)0x0;
  this->insert_size_sum_ccdf = _Var2._M_head_impl;
  std::
  unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
                 *)&local_18);
  std::
  unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
                 *)local_20);
  return;
}

Assistant:

AnyDistributionEdgeCalculator::AnyDistributionEdgeCalculator(double significance_level, const HistogramBasedDistribution& ild) : significance_level(significance_level) {
	this->insert_size_dist = ild.toDistribution(1e-4, &insert_size_dist_offset).release();
// 	cerr << "Using internal segment size distribution: " << endl;
// 	for (int i=0; i < (int)insert_size_dist->size(); ++i) {
// 		cerr << (i+insert_size_dist_offset) << " " << insert_size_dist->at(i) << endl;
// 	}
	// since we truncated the tails (a bit), we renormalize back to one
	double sum = 0.0;
	for (size_t i=0; i < insert_size_dist->size(); ++i) sum += insert_size_dist->at(i);
	for (size_t i=0; i < insert_size_dist->size(); ++i) insert_size_dist->at(i) /= sum;
	allowable_insert_size_diff = computeAllowableInsertSizeDiff();
	// cout << "allowable insert size difference: " << allowable_insert_size_diff << endl;
	unique_ptr<vector<double> > insert_size_sum_dist = Distributions::convolve(*insert_size_dist, *insert_size_dist, insert_size_dist_offset, insert_size_dist_offset, &insert_size_sum_ccdf_offset);
	this->insert_size_sum_ccdf = Distributions::toCCDF(*insert_size_sum_dist).release();
}